

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::Parser(Parser *this,TokenBuffer *input)

{
  ParserInputState *this_00;
  Ref *pRVar1;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_00243b18;
  this_00 = (ParserInputState *)operator_new(0x38);
  ParserInputState::ParserInputState(this_00,input);
  pRVar1 = (Ref *)operator_new(0x10);
  pRVar1->ptr = this_00;
  pRVar1->count = 1;
  (this->inputState).ref = pRVar1;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->returnAST).ref = (Ref *)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ASTFactory::ASTFactory(&this->astFactory);
  return;
}

Assistant:

Parser::Parser(TokenBuffer* input)
: inputState(new ParserInputState(input))
{
}